

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFastFieldEntries
          (ParseFunctionGenerator *this,Formatter *format,string *fallback)

{
  TailCallTableInfo *pTVar1;
  pointer pFVar2;
  LogMessage *other;
  uint64_t uVar3;
  string *args;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  cpp *this_00;
  pointer pFVar4;
  uchar local_6b;
  unsigned_short local_6a;
  LogMessage local_68;
  
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::TailCallTableInfo_*,_false>.
           _M_head_impl;
  pFVar2 = *(pointer *)
            ((long)&(pTVar1->fast_path_fields).
                    super__Vector_base<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
            + 8);
  for (pFVar4 = *(pointer *)
                 &(pTVar1->fast_path_fields).
                  super__Vector_base<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo,_std::allocator<google::protobuf::compiler::cpp::TailCallTableInfo::FieldInfo>_>
      ; pFVar4 != pFVar2; pFVar4 = pFVar4 + 1) {
    if (pFVar4->field != (FieldDescriptor *)0x0) {
      PrintFieldComment<google::protobuf::FieldDescriptor>(format,pFVar4->field);
    }
    args = &pFVar4->func_name;
    if ((pFVar4->func_name)._M_string_length == 0) {
      args = fallback;
    }
    Formatter::operator()(format,"{$1$, ",args);
    uVar3 = (pFVar4->bits).data;
    if (uVar3 == 0) {
      Formatter::operator()<>(format,"{}");
    }
    else {
      this_00 = (cpp *)pFVar4->field;
      field = extraout_RDX;
      if (this_00 == (cpp *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                   ,0x262);
        other = internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (nullptr) != (info.field): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_6a,other);
        internal::LogMessage::~LogMessage(&local_68);
        this_00 = (cpp *)pFVar4->field;
        uVar3 = (pFVar4->bits).data;
        field = extraout_RDX_00;
      }
      local_6a = (unsigned_short)uVar3;
      local_6b = (uchar)(uVar3 >> 0x10);
      FieldName_abi_cxx11_((string *)&local_68,this_00,field);
      Formatter::operator()
                (format,
                 "{$1$, $2$, static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
                 &local_6a,&local_6b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    Formatter::operator()<>(format,"},\n");
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFastFieldEntries(
    Formatter& format, const std::string& fallback) {
  for (const auto& info : tc_table_info_->fast_path_fields) {
    if (info.field != nullptr) {
      PrintFieldComment(format, info.field);
    }
    format("{$1$, ", info.func_name.empty() ? fallback : info.func_name);
    if (info.bits.data) {
      GOOGLE_DCHECK_NE(nullptr, info.field);
      format(
          "{$1$, $2$, "
          "static_cast<uint16_t>(PROTOBUF_FIELD_OFFSET($classname$, $3$_))}",
          info.bits.coded_tag(), info.bits.hasbit_idx(), FieldName(info.field));
    } else {
      format("{}");
    }
    format("},\n");
  }
}